

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.h
# Opt level: O0

void __thiscall source::source(source *this,int _connfd)

{
  initializer_list<map_item> __l;
  map_item *local_1c8;
  allocator<map_item> local_1a2;
  undefined1 local_1a1;
  CharContent local_1a0;
  CharContent local_178;
  CharContent local_150;
  CharContent local_118;
  map_item *local_f0;
  map_item local_e8;
  map_item local_88;
  undefined1 local_28 [28];
  int _connfd_local;
  source *this_local;
  
  this->_vptr_source = (_func_int **)&PTR__source_00132cd8;
  this->_conndfd = _connfd;
  local_1a1 = 1;
  local_f0 = &local_e8;
  local_28._20_4_ = _connfd;
  unique0x10000222 = this;
  CharContent::CharContent(&local_118,"/static");
  CharContent::CharContent(&local_150,"~/ServerContent");
  map_item::map_item(&local_e8,&local_118,&local_150,1);
  local_f0 = &local_88;
  CharContent::CharContent(&local_178,"/");
  CharContent::CharContent(&local_1a0,"~/ServerContent/cgi");
  map_item::map_item(&local_88,&local_178,&local_1a0,0);
  local_1a1 = 0;
  local_28._0_8_ = &local_e8;
  local_28._8_8_ = (_func_int **)0x2;
  std::allocator<map_item>::allocator(&local_1a2);
  __l._M_len = local_28._8_8_;
  __l._M_array = (iterator)local_28._0_8_;
  std::vector<map_item,_std::allocator<map_item>_>::vector(&this->url_maps,__l,&local_1a2);
  std::allocator<map_item>::~allocator(&local_1a2);
  local_1c8 = (map_item *)local_28;
  do {
    local_1c8 = local_1c8 + -1;
    map_item::~map_item(local_1c8);
  } while (local_1c8 != &local_e8);
  CharContent::~CharContent(&local_1a0);
  CharContent::~CharContent(&local_178);
  CharContent::~CharContent(&local_150);
  CharContent::~CharContent(&local_118);
  return;
}

Assistant:

source(int _connfd):_conndfd(_connfd),
                        url_maps({
                                         map_item("/static","~/ServerContent",1),
                                         map_item("/","~/ServerContent/cgi",0)
                                 }){}